

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

int __thiscall QObject::startTimer(QObject *this,nanoseconds interval,TimerType timerType)

{
  Duration interval_00;
  bool bVar1;
  QThread *file;
  QThread *pQVar2;
  Type this_00;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QObjectPrivate *in_RDI;
  long in_FS_OFFSET;
  TimerId timerId;
  Type dispatcher;
  Type thisThreadData;
  QObjectPrivate *d;
  undefined4 in_stack_ffffffffffffff18;
  parameter_type in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff28;
  TimerType in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff58;
  TimerId local_94;
  QMessageLogger local_88;
  QMessageLogger local_68;
  rep local_48;
  undefined8 local_40;
  QMessageLogger local_38;
  rep local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  d_func((QObject *)0x3ee74c);
  local_18 = (rep)ns<(char)48>();
  bVar1 = std::chrono::operator<
                    (in_stack_ffffffffffffff28,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)
                     CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::warning
              (&local_38,
               "QObject::startTimer: negative intervals aren\'t allowed; the interval will be set to 1ms."
              );
    local_48 = (rep)ms<(char)49>();
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_10 = local_40;
  }
  QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x3ee7e5);
  bVar1 = QThreadData::hasEventDispatcher((QThreadData *)0x3ee7f4);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    file = thread((QObject *)0x3ee843);
    pQVar2 = QThread::currentThread();
    if (file == pQVar2) {
      this_00 = QBasicAtomicPointer<QAbstractEventDispatcher>::loadRelaxed
                          ((QBasicAtomicPointer<QAbstractEventDispatcher> *)0x3ee8a3);
      interval_00.__r._4_4_ = in_EDX;
      interval_00.__r._0_4_ = in_stack_ffffffffffffff58;
      local_94 = QAbstractEventDispatcher::registerTimer
                           (this_00,interval_00,in_stack_ffffffffffffff3c,(QObject *)in_RDI);
      QObjectPrivate::ensureExtraData(in_RDI);
      QList<Qt::TimerId>::append((QList<Qt::TimerId> *)0x3ee8f1,in_stack_ffffffffffffff1c);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,(char *)file,in_stack_ffffffffffffff24,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QMessageLogger::warning
                (&local_88,"QObject::startTimer: Timers cannot be started from another thread");
      local_94 = Invalid;
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
               (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QMessageLogger::warning
              (&local_68,
               "QObject::startTimer: Timers can only be used with threads started with QThread");
    local_94 = Invalid;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_94;
}

Assistant:

int QObject::startTimer(std::chrono::nanoseconds interval, Qt::TimerType timerType)
{
    Q_D(QObject);

    using namespace std::chrono_literals;

    if (interval < 0ns) {
        qWarning("QObject::startTimer: negative intervals aren't allowed; the "
                 "interval will be set to 1ms.");
        interval = 1ms;
    }

    auto thisThreadData = d->threadData.loadRelaxed();
    if (Q_UNLIKELY(!thisThreadData->hasEventDispatcher())) {
        qWarning("QObject::startTimer: Timers can only be used with threads started with QThread");
        return 0;
    }
    if (Q_UNLIKELY(thread() != QThread::currentThread())) {
        qWarning("QObject::startTimer: Timers cannot be started from another thread");
        return 0;
    }

    auto dispatcher = thisThreadData->eventDispatcher.loadRelaxed();
    Qt::TimerId timerId = dispatcher->registerTimer(interval, timerType, this);
    d->ensureExtraData();
    d->extraData->runningTimers.append(timerId);
    return int(timerId);
}